

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCorrFunc.cpp
# Opt level: O3

void __thiscall OpenMD::TimeCorrFunc<int>::correlation(TimeCorrFunc<int> *this)

{
  int iVar1;
  double dVar2;
  pointer piVar3;
  pointer piVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  if (this->nTimeBins_ != 0) {
    piVar3 = (this->histogram_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (this->count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = 0;
    do {
      piVar3[uVar8] = 0;
      piVar4[uVar8] = 0;
      uVar8 = uVar8 + 1;
    } while (uVar8 < this->nTimeBins_);
  }
  ProgressBar::clear((this->progressBar_)._M_t.
                     super___uniq_ptr_impl<OpenMD::ProgressBar,_std::default_delete<OpenMD::ProgressBar>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_OpenMD::ProgressBar_*,_std::default_delete<OpenMD::ProgressBar>_>
                     .super__Head_base<0UL,_OpenMD::ProgressBar_*,_false>._M_head_impl);
  iVar5 = this->nFrames_;
  if (0 < iVar5) {
    iVar1 = iVar5 + 1;
    dVar12 = (double)iVar5;
    uVar8 = 0;
    iVar7 = 0;
    do {
      lVar6 = (long)iVar5;
      if ((long)uVar8 < lVar6) {
        dVar2 = (this->times_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar8];
        iVar9 = 0;
        uVar10 = uVar8;
        do {
          ProgressBar::setStatus
                    ((this->progressBar_)._M_t.
                     super___uniq_ptr_impl<OpenMD::ProgressBar,_std::default_delete<OpenMD::ProgressBar>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_OpenMD::ProgressBar_*,_std::default_delete<OpenMD::ProgressBar>_>
                     .super__Head_base<0UL,_OpenMD::ProgressBar_*,_false>._M_head_impl,
                     (double)(iVar9 + iVar7 + 1),dVar12 * (double)iVar1 * 0.5);
          ProgressBar::update((this->progressBar_)._M_t.
                              super___uniq_ptr_impl<OpenMD::ProgressBar,_std::default_delete<OpenMD::ProgressBar>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_OpenMD::ProgressBar_*,_std::default_delete<OpenMD::ProgressBar>_>
                              .super__Head_base<0UL,_OpenMD::ProgressBar_*,_false>._M_head_impl);
          dVar13 = (this->times_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar10] - dVar2;
          dVar11 = this->dtMean_;
          if (this->dtSigma_ * 6.0 * (double)iVar9 < ABS(dVar13 - (double)iVar9 * dVar11)) {
            snprintf(painCave.errMsg,2000,
                     "TimeCorrFunc::correlateBlocks: mean sampleTime (%f)\n\tin %s does not match actual time-spacing between\n\tconfigurations %d (t = %f) and %d (t = %f).\n"
                     ,dVar11,dVar2,(this->dumpFilename_)._M_dataplus._M_p,uVar8 & 0xffffffff,
                     uVar10 & 0xffffffff);
            painCave.severity = (uint)this->allowTimeFuzz_ * 2 + 1;
            painCave.isFatal = (int)(this->allowTimeFuzz_ ^ 1);
            simError();
            dVar11 = this->dtMean_;
          }
          (*(this->super_DynamicProperty)._vptr_DynamicProperty[8])
                    (this,uVar8 & 0xffffffff,uVar10 & 0xffffffff,
                     (ulong)(uint)(int)(dVar13 / dVar11 + 0.5));
          uVar10 = uVar10 + 1;
          iVar5 = this->nFrames_;
          iVar9 = iVar9 + 1;
        } while ((int)uVar10 < iVar5);
        lVar6 = (long)iVar5;
        iVar7 = iVar7 + iVar9;
      }
      uVar8 = uVar8 + 1;
    } while ((long)uVar8 < lVar6);
  }
  return;
}

Assistant:

void TimeCorrFunc<T>::correlation() {
    T zeroType(0.0);
    for (unsigned int i = 0; i < nTimeBins_; ++i) {
      histogram_[i] = zeroType;
      count_[i]     = 0;
    }

    progressBar_->clear();
    RealType samples = 0.5 * (nFrames_ + 1) * nFrames_;
    int visited      = 0;

    for (int i = 0; i < nFrames_; ++i) {
      RealType time1 = times_[i];

      for (int j = i; j < nFrames_; ++j) {
        visited++;
        progressBar_->setStatus(visited, samples);
        progressBar_->update();

        // Perform a sanity check on the actual configuration times to
        // make sure the configurations are spaced the same amount the
        // sample time said they were spaced:

        RealType time2 = times_[j];

        if (std::fabs((time2 - time1) - (j - i) * dtMean_) >
            6 * dtSigma_ * (j - i)) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "TimeCorrFunc::correlateBlocks: mean sampleTime (%f)\n"
                   "\tin %s does not match actual time-spacing between\n"
                   "\tconfigurations %d (t = %f) and %d (t = %f).\n",
                   dtMean_, dumpFilename_.c_str(), i, time1, j, time2);
          if (allowTimeFuzz_) {
            painCave.isFatal  = 0;
            painCave.severity = OPENMD_INFO;
          } else {
            painCave.isFatal  = 1;
            painCave.severity = OPENMD_ERROR;
          }
          simError();
        }

        int timeBin = int((time2 - time1) / dtMean_ + 0.5);
        correlateFrames(i, j, timeBin);
      }
    }
  }